

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5DestroyMethod(sqlite3_vtab *pVtab)

{
  sqlite3_module *psVar1;
  _func_int_sqlite3_ptr_void_ptr_int_char_ptr_ptr_sqlite3_vtab_ptr_ptr_char_ptr_ptr *p_Var2;
  _func_int_sqlite3_ptr_void_ptr_int_char_ptr_ptr_sqlite3_vtab_ptr_ptr_char_ptr_ptr *p_Var3;
  int iVar4;
  
  psVar1 = pVtab[1].pModule;
  p_Var2 = psVar1->xCreate;
  p_Var3 = psVar1->xConnect;
  iVar4 = fts5ExecPrintf(*(sqlite3 **)psVar1,(char **)0x0,
                         "DROP TABLE IF EXISTS %Q.\'%q_data\';DROP TABLE IF EXISTS %Q.\'%q_idx\';DROP TABLE IF EXISTS %Q.\'%q_config\';"
                         ,p_Var2,p_Var3,p_Var2,p_Var3,p_Var2,p_Var3);
  if (iVar4 == 0) {
    if ((*(int *)&psVar1->xColumn != 0) &&
       (iVar4 = fts5ExecPrintf(*(sqlite3 **)psVar1,(char **)0x0,
                               "DROP TABLE IF EXISTS %Q.\'%q_docsize\';",psVar1->xCreate,
                               psVar1->xConnect), iVar4 != 0)) {
      return iVar4;
    }
    if ((*(int *)&psVar1->xFilter == 0) &&
       (iVar4 = fts5ExecPrintf(*(sqlite3 **)psVar1,(char **)0x0,
                               "DROP TABLE IF EXISTS %Q.\'%q_content\';",psVar1->xCreate,
                               psVar1->xConnect), iVar4 != 0)) {
      return iVar4;
    }
    fts5FreeVtab((Fts5FullTable *)pVtab);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

static int fts5DestroyMethod(sqlite3_vtab *pVtab){
  Fts5Table *pTab = (Fts5Table*)pVtab;
  int rc = sqlite3Fts5DropAll(pTab->pConfig);
  if( rc==SQLITE_OK ){
    fts5FreeVtab((Fts5FullTable*)pVtab);
  }
  return rc;
}